

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O2

void __thiscall vm_meta_entry_t::release_mem(vm_meta_entry_t *this)

{
  if (this->prop_xlat_ != (unsigned_short *)0x0) {
    free(this->prop_xlat_);
    this->prop_xlat_ = (unsigned_short *)0x0;
  }
  if (this->func_xlat_ != (vm_prop_id_t *)0x0) {
    free(this->func_xlat_);
    this->func_xlat_ = (vm_prop_id_t *)0x0;
  }
  lib_free_str(this->image_meta_name_);
  return;
}

Assistant:

void release_mem()
    {
        /* if this entry has a property table, delete it */
        if (prop_xlat_ != 0)
        {
            /* free it */
            t3free(prop_xlat_);
            
            /* forget the pointer */
            prop_xlat_ = 0;
        }

        /* if this entry has a function translation table, delete it */
        if (func_xlat_ != 0)
        {
            /* free it */
            t3free(func_xlat_);
            
            /* forget the pointer */
            func_xlat_ = 0;
        }

        /* relesae our stored name */
        lib_free_str(image_meta_name_);
    }